

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigrecord_r.hh
# Opt level: O0

void avro::codec_traits<testgen_r::_bigrecord_r_Union__0__>::decode
               (Decoder *d,_bigrecord_r_Union__0__ *v)

{
  _bigrecord_r_Union__0__ *this;
  undefined8 uVar1;
  long *in_RDI;
  int32_t vv_1;
  string vv;
  size_t n;
  string *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  Exception *in_stack_ffffffffffffff70;
  string local_70 [16];
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffb4;
  
  this = (_bigrecord_r_Union__0__ *)(**(code **)(*in_RDI + 0xb0))();
  if (this < (_bigrecord_r_Union__0__ *)0x2) {
    if (this == (_bigrecord_r_Union__0__ *)0x0) {
      t = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70;
      std::__cxx11::string::string((string *)t);
      decode<std::__cxx11::string>((Decoder *)this,t);
      testgen_r::_bigrecord_r_Union__0__::set_string(this,t);
      std::__cxx11::string::~string(local_70);
    }
    else if (this == (_bigrecord_r_Union__0__ *)0x1) {
      decode<int>((Decoder *)0x1,(int *)in_stack_ffffffffffffff68);
      testgen_r::_bigrecord_r_Union__0__::set_int(this,(int32_t *)in_stack_ffffffffffffff68);
    }
    return;
  }
  uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffb0);
  uVar1 = __cxa_allocate_exception(0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,uVar2),(char *)in_stack_ffffffffffffffa8,
             (allocator<char> *)in_stack_ffffffffffffffa0);
  Exception::Exception(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  __cxa_throw(uVar1,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

static void decode(Decoder& d, testgen_r::_bigrecord_r_Union__0__& v) {
        size_t n = d.decodeUnionIndex();
        if (n >= 2) { throw avro::Exception("Union index too big"); }
        switch (n) {
        case 0:
            {
                std::string vv;
                avro::decode(d, vv);
                v.set_string(vv);
            }
            break;
        case 1:
            {
                int32_t vv;
                avro::decode(d, vv);
                v.set_int(vv);
            }
            break;
        }
    }